

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureMS5611.cpp
# Opt level: O0

void __thiscall RTPressureMS5611::pressureBackground(RTPressureMS5611 *this)

{
  int iVar1;
  bool bVar2;
  uint64_t uVar3;
  long lVar4;
  long local_50;
  int64_t sens2;
  int64_t offset2;
  int64_t T2;
  int64_t sens;
  int64_t offset;
  int32_t temperature;
  int64_t deltaT;
  RTPressureMS5611 *pRStack_10;
  uint8_t data [3];
  RTPressureMS5611 *this_local;
  
  iVar1 = this->m_state;
  if (iVar1 != 0) {
    pRStack_10 = this;
    if (iVar1 == 1) {
      uVar3 = RTMath::currentUSecsSinceEpoch();
      if ((9999 < uVar3 - this->m_timer) &&
         (bVar2 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                    this->m_pressureAddr,'\0','\x03',(uchar *)((long)&deltaT + 5),
                                    "Failed to read MS5611 temperature"), bVar2)) {
        this->m_D2 = (uint)deltaT._5_1_ * 0x10000 + (uint)deltaT._6_1_ * 0x100 + (uint)deltaT._7_1_;
        lVar4 = (long)(int)(this->m_D2 + (uint)this->m_calData[4] * -0x100);
        iVar1 = (int)((long)(lVar4 * (ulong)this->m_calData[5]) >> 0x17);
        offset._4_4_ = iVar1 + 2000;
        sens = (ulong)this->m_calData[1] * 0x10000 +
               ((long)((ulong)this->m_calData[3] * lVar4) >> 7);
        T2 = (ulong)this->m_calData[0] * 0x8000 + ((long)((ulong)this->m_calData[2] * lVar4) >> 8);
        if (offset._4_4_ < 2000) {
          sens2 = (int64_t)((iVar1 * iVar1 * 5) / 2);
          local_50 = sens2 / 2;
          if (offset._4_4_ < -0x5dc) {
            sens2 = (iVar1 + 0xdac) * 7 * (iVar1 + 0xdac) + sens2;
            local_50 = ((iVar1 + 0xdac) * (iVar1 + 0xdac) * 0xb) / 2 + local_50;
          }
          offset._4_4_ = offset._4_4_ - (int)(lVar4 * lVar4 >> 0x1f);
          sens = sens - sens2;
          T2 = T2 - local_50;
        }
        this->m_pressure = (float)(((long)((ulong)this->m_D1 * T2) >> 0x15) - sens >> 0xf) / 100.0;
        this->m_temperature = (float)offset._4_4_ / 100.0;
        this->m_validReadings = true;
        this->m_state = 0;
      }
    }
    else if (((iVar1 == 2) &&
             (uVar3 = RTMath::currentUSecsSinceEpoch(), 9999 < uVar3 - this->m_timer)) &&
            (bVar2 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                       this->m_pressureAddr,'\0','\x03',(uchar *)((long)&deltaT + 5)
                                       ,"Failed to read MS5611 pressure"), bVar2)) {
      this->m_D1 = (uint)deltaT._5_1_ * 0x10000 + (uint)deltaT._6_1_ * 0x100 + (uint)deltaT._7_1_;
      bVar2 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                 this->m_pressureAddr,'X','\0',(uchar *)0x0,
                                 "Failed to start MS5611 temperature conversion");
      if (bVar2) {
        this->m_state = 1;
        uVar3 = RTMath::currentUSecsSinceEpoch();
        this->m_timer = uVar3;
      }
    }
  }
  return;
}

Assistant:

void RTPressureMS5611::pressureBackground()
{
    uint8_t data[3];

    switch (m_state) {
        case MS5611_STATE_IDLE:
        break;

        case MS5611_STATE_PRESSURE:
        if ((RTMath::currentUSecsSinceEpoch() - m_timer) < 10000)
            break;                                          // not time yet
        if (!m_settings->HALRead(m_pressureAddr, MS5611_CMD_ADC, 3, data, "Failed to read MS5611 pressure")) {
            break;
        }
        m_D1 = (((uint32_t)data[0]) << 16) + (((uint32_t)data[1]) << 8) + (uint32_t)data[2];

        // start temperature conversion

        if (!m_settings->HALWrite(m_pressureAddr, MS5611_CMD_CONV_D2, 0, 0, "Failed to start MS5611 temperature conversion")) {
            break;
        } else {
            m_state = MS5611_STATE_TEMPERATURE;
            m_timer = RTMath::currentUSecsSinceEpoch();
        }
        break;

        case MS5611_STATE_TEMPERATURE:
        if ((RTMath::currentUSecsSinceEpoch() - m_timer) < 10000)
            break;                                          // not time yet
        if (!m_settings->HALRead(m_pressureAddr, MS5611_CMD_ADC, 3, data, "Failed to read MS5611 temperature")) {
            break;
        }
        m_D2 = (((uint32_t)data[0]) << 16) + (((uint32_t)data[1]) << 8) + (uint32_t)data[2];

        //  call this function for testing only
        //  should give T = 2007 (20.07C) and pressure 100009 (1000.09hPa)

        // setTestData();

        //  now calculate the real values

        int64_t deltaT = (int32_t)m_D2 - (((int32_t)m_calData[4]) << 8);

        int32_t temperature = 2000 + ((deltaT * (int64_t)m_calData[5]) >> 23); // note - this needs to be divided by 100

        int64_t offset = ((int64_t)m_calData[1] << 16) + (((int64_t)m_calData[3] * deltaT) >> 7);
        int64_t sens = ((int64_t)m_calData[0] << 15) + (((int64_t)m_calData[2] * deltaT) >> 8);

        //  do second order temperature compensation

        if (temperature < 2000) {
            int64_t T2 = (deltaT * deltaT) >> 31;
            int64_t offset2 = 5 * ((temperature - 2000) * (temperature - 2000)) / 2;
            int64_t sens2 = offset2 / 2;
            if (temperature < -1500) {
                offset2 += 7 * (temperature + 1500) * (temperature + 1500);
                sens2 += 11 * ((temperature + 1500) * (temperature + 1500)) / 2;
            }
            temperature -= T2;
            offset -= offset2;
            sens -=sens2;
        }

        m_pressure = (RTFLOAT)(((((int64_t)m_D1 * sens) >> 21) - offset) >> 15) / (RTFLOAT)100.0;
        m_temperature = (RTFLOAT)temperature/(RTFLOAT)100;

        // printf("Temp: %f, pressure: %f\n", m_temperature, m_pressure);

        m_validReadings = true;
        m_state = MS5611_STATE_IDLE;
        break;
    }
}